

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetadataTree.cpp
# Opt level: O0

ostream * __thiscall cali::internal::MetadataTree::print_statistics(MetadataTree *this,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  MetadataTree *this_local;
  
  poVar1 = std::operator<<(os,"  Metadata tree: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_num_blocks);
  poVar1 = std::operator<<(poVar1," blocks, ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_num_nodes);
  poVar1 = std::operator<<(poVar1," nodes\n   ");
  MemoryPool::print_statistics(&this->m_mempool,poVar1);
  return os;
}

Assistant:

std::ostream& MetadataTree::print_statistics(std::ostream& os) const
{
    m_mempool.print_statistics(
        os << "  Metadata tree: " << m_num_blocks << " blocks, " << m_num_nodes << " nodes\n   "
    );

    return os;
}